

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O3

int Mecab_refresh(Mecab *m)

{
  char **__ptr;
  long lVar1;
  
  __ptr = m->feature;
  if (__ptr != (char **)0x0) {
    if (0 < m->size) {
      lVar1 = 0;
      do {
        free(m->feature[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < m->size);
      __ptr = m->feature;
    }
    free(__ptr);
    m->feature = (char **)0x0;
    m->size = 0;
  }
  return 1;
}

Assistant:

BOOL Mecab_refresh(Mecab *m)
{
   int i;

   if(m->feature != NULL) {
      for(i = 0; i < m->size; i++)
         free(m->feature[i]);
      free(m->feature);
      m->feature = NULL;
      m->size = 0;
   }

   return TRUE;
}